

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O1

error<idx2::mmap_err_code>
idx2::MapVolume(cstr FileName,v3i *Dims3,dtype DType,mmap_volume *Vol,map_mode Mode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  i64 iVar6;
  long *in_FS_OFFSET;
  error<idx2::mmap_err_code> eVar7;
  
  eVar7 = OpenFile(&Vol->MMap,FileName,Mode);
  if (eVar7.Code == NoError) {
    if (Mode == Write) {
      if (DType < __Invalid__) {
        lVar4 = *(long *)(&DAT_001a8d98 + (ulong)DType * 8);
      }
      else {
        lVar4 = 0;
      }
      iVar6 = (long)(Dims3->field_0).field_0.Z *
              (long)(Dims3->field_0).field_0.Y * (long)(Dims3->field_0).field_0.X * lVar4;
    }
    else {
      iVar6 = 0;
    }
    eVar7 = MapFile(&Vol->MMap,iVar6);
    if (eVar7.Code == NoError) {
      uVar1 = (Dims3->field_0).field_0.X;
      uVar2 = (Dims3->field_0).field_0.Y;
      uVar3 = (Dims3->field_0).field_0.Z;
      (Vol->Vol).Buffer.Alloc = (Vol->MMap).Buf.Alloc;
      iVar6 = (Vol->MMap).Buf.Bytes;
      (Vol->Vol).Buffer.Data = (Vol->MMap).Buf.Data;
      (Vol->Vol).Buffer.Bytes = iVar6;
      (Vol->Vol).Dims =
           (ulong)(uVar3 & 0x1fffff) << 0x2a |
           ((ulong)uVar2 & 0x1fffff) << 0x15 | (ulong)uVar1 & 0x1fffff;
      (Vol->Vol).Type = DType;
      *(char **)(*in_FS_OFFSET + -0x480) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x280) = 0x4a;
      eVar7 = (error<idx2::mmap_err_code>)ZEXT816(0x1a94c3);
    }
  }
  uVar5 = eVar7._8_8_ & 0xffffffffffff;
  eVar7.Code = (int)uVar5;
  eVar7.StackIdx = (char)(uVar5 >> 0x20);
  eVar7.StrGened = (bool)(char)(uVar5 >> 0x28);
  eVar7._14_2_ = (short)(uVar5 >> 0x30);
  return eVar7;
}

Assistant:

error<mmap_err_code>
MapVolume(cstr FileName, const v3i& Dims3, dtype DType, mmap_volume* Vol, map_mode Mode)
{
  idx2_ReturnIfError(OpenFile(&Vol->MMap, FileName, Mode));
  if (Mode == map_mode::Write)
  {
    idx2_ReturnIfError(MapFile(&Vol->MMap, Prod<u64>(Dims3) * SizeOf(DType)));
  }
  else
  {
    idx2_ReturnIfError(MapFile(&Vol->MMap));
  }
  Vol->Vol = volume(Vol->MMap.Buf, Dims3, DType);
  return idx2_Error(mmap_err_code::NoError);
}